

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFontGlyph * __thiscall ImFont::FindGlyph(ImFont *this,ImWchar c)

{
  ushort uVar1;
  ImWchar i;
  ImWchar c_local;
  ImFont *this_local;
  ImFontGlyph *local_8;
  
  if ((uint)c < (uint)(this->IndexLookup).Size) {
    uVar1 = (this->IndexLookup).Data[c];
    if (uVar1 == 0xffff) {
      local_8 = this->FallbackGlyph;
    }
    else {
      local_8 = (this->Glyphs).Data + uVar1;
    }
  }
  else {
    local_8 = this->FallbackGlyph;
  }
  return local_8;
}

Assistant:

const ImFontGlyph* ImFont::FindGlyph(ImWchar c) const
{
    if (c >= (size_t)IndexLookup.Size)
        return FallbackGlyph;
    const ImWchar i = IndexLookup.Data[c];
    if (i == (ImWchar)-1)
        return FallbackGlyph;
    return &Glyphs.Data[i];
}